

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
spdlog::details::
make_unique<spdlog::pattern_formatter,std::__cxx11::string,spdlog::pattern_time_type&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          pattern_time_type *args_1)

{
  string *in_RSI;
  __uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
  in_RDI;
  pointer in_stack_ffffffffffffff18;
  __uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> *this;
  __uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
  local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  custom_flags *custom_user_flags;
  string *eol;
  pattern_time_type time_type;
  string *pattern;
  pattern_formatter *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [32];
  string local_38 [40];
  string *local_10;
  
  local_10 = in_RSI;
  operator_new(0xe0);
  std::__cxx11::string::string(local_38,local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"\n",&local_59);
  eol = (string *)0x0;
  time_type = local;
  local_98 = 0;
  custom_user_flags = (custom_flags *)0x0;
  local_a8._M_t.
  super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
  .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl =
       (tuple<spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>)
       (_Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
        )0x0;
  uStack_a0 = 0;
  pattern = (string *)0x0;
  this = &local_a8;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)0x33b8ba);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffff90,pattern,time_type,eol,custom_user_flags);
  std::unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>>::
  unique_ptr<std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)this,in_stack_ffffffffffffff18);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x33b8fd);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::~string(local_38);
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(tuple<spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>)
           in_RDI.
           super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
           .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args) {
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}